

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::ScalarReplacementPass::IsSpecConstant(ScalarReplacementPass *this,uint32_t id)

{
  IRContext *this_00;
  int32_t iVar1;
  Instruction *pIVar2;
  
  this_00 = (this->super_MemPass).super_Pass.context_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  pIVar2 = analysis::DefUseManager::GetDef
                     ((this_00->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,id);
  if (pIVar2 != (Instruction *)0x0) {
    iVar1 = spvOpcodeIsSpecConstant(pIVar2->opcode_);
    return iVar1 != 0;
  }
  __assert_fail("inst",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                ,0x24d,"bool spvtools::opt::ScalarReplacementPass::IsSpecConstant(uint32_t) const");
}

Assistant:

bool ScalarReplacementPass::IsSpecConstant(uint32_t id) const {
  const Instruction* inst = get_def_use_mgr()->GetDef(id);
  assert(inst);
  return spvOpcodeIsSpecConstant(inst->opcode());
}